

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

FName __thiscall
CommandDrawSwitchableImage::LookupKeySpecies(CommandDrawSwitchableImage *this,int keynum)

{
  PClassActor *this_00;
  bool bVar1;
  uint uVar2;
  PClassActor **ppPVar3;
  AActor *pAVar4;
  AKey *key;
  PClassActor *cls;
  uint i;
  int keynum_local;
  
  cls._0_4_ = 0;
  do {
    uVar2 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses);
    if (uVar2 <= (uint)cls) {
      FName::FName((FName *)this,NAME_None);
LAB_0080ceed:
      return (FName)(int)this;
    }
    ppPVar3 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                        (&PClassActor::AllActorClasses,(ulong)(uint)cls);
    this_00 = *ppPVar3;
    bVar1 = PClass::IsDescendantOf(&this_00->super_PClass,AKey::RegistrationInfo.MyClass);
    if ((bVar1) &&
       (pAVar4 = GetDefaultByType(&this_00->super_PClass),
       (uint)*(byte *)((long)&pAVar4[1].snext + 4) == keynum)) {
      FName::FName((FName *)this,&(this_00->super_PClass).super_PStruct.super_PNamedType.TypeName);
      goto LAB_0080ceed;
    }
    cls._0_4_ = (uint)cls + 1;
  } while( true );
}

Assistant:

static FName LookupKeySpecies(int keynum)
		{
			for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
			{
				PClassActor *cls = PClassActor::AllActorClasses[i];
				if (cls->IsDescendantOf(RUNTIME_CLASS(AKey)))
				{
					AKey *key = (AKey *)GetDefaultByType(cls);
					if (key->KeyNumber == keynum)
						return cls->TypeName;
				}
			}
			return NAME_None;
		}